

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::CopyPropagateArrays::IsInterpolationInstruction
          (CopyPropagateArrays *this,Instruction *inst)

{
  IRContext *this_00;
  uint32_t uVar1;
  uint uVar2;
  
  if (inst->opcode_ == OpExtInst) {
    uVar1 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar1 = (uint)inst->has_result_id_;
    }
    uVar1 = Instruction::GetSingleWordOperand(inst,uVar1);
    this_00 = (this->super_MemPass).super_Pass.context_;
    if ((this_00->feature_mgr_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
        .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
        (FeatureManager *)0x0) {
      IRContext::AnalyzeFeatures(this_00);
    }
    if (uVar1 == ((this_00->feature_mgr_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                  .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl)->
                 extinst_importid_GLSLstd450_) {
      uVar2 = (inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar2 = (uint)inst->has_result_id_;
      }
      uVar1 = Instruction::GetSingleWordOperand(inst,uVar2 + 1);
      if (uVar1 - 0x4c < 3) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool CopyPropagateArrays::IsInterpolationInstruction(Instruction* inst) {
  if (inst->opcode() == spv::Op::OpExtInst &&
      inst->GetSingleWordInOperand(kExtInstSetInIdx) ==
          context()->get_feature_mgr()->GetExtInstImportId_GLSLstd450()) {
    uint32_t ext_inst = inst->GetSingleWordInOperand(kExtInstOpInIdx);
    switch (ext_inst) {
      case GLSLstd450InterpolateAtCentroid:
      case GLSLstd450InterpolateAtOffset:
      case GLSLstd450InterpolateAtSample:
        return true;
    }
  }
  return false;
}